

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO3Segment<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          FeLagrangeO3Segment<double> *this,MatrixXd *refcoords)

{
  Index IVar1;
  RowXpr local_11c0;
  double local_1188;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
  local_1180;
  int local_1124;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_1120;
  double local_10c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_10b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
  local_1058;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
  local_f88;
  RowXpr local_e50;
  double local_e18;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_e10;
  int local_dac;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_da8;
  double local_d48;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_d40;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
  local_ce0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
  local_c10;
  RowXpr local_ad0;
  double local_a98;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
  local_a90;
  double local_a38;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
  local_a30;
  double local_9d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_9d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
  local_970;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
  local_8a8;
  RowXpr local_778;
  double local_740;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_738;
  double local_6d8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_6d0;
  double local_670;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_668;
  double local_608;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
  local_600;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
  local_578;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
  local_480;
  ConstRowXpr local_318;
  undefined1 local_2e0 [8];
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> x;
  uint local_2a0;
  allocator<char> local_299;
  size_type n_pts;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *refcoords_local;
  FeLagrangeO3Segment<double> *this_local;
  Matrix<double,__1,__1,_0,__1,__1> *result;
  
  local_20 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)refcoords;
  refcoords_local = (MatrixXd *)this;
  this_local = (FeLagrangeO3Segment<double> *)__return_storage_ptr__;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 == 1) {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
    local_2a0 = (uint)IVar1;
    x.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
    m_outerStride._7_1_ = 0;
    x.m_expression.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
    m_outerStride._0_4_ = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
              ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
               (int *)&x.m_expression.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                       .m_outerStride,&local_2a0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_318,local_20,0);
    Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    array((ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
           *)local_2e0,
          (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *
          )&local_318);
    local_608 = 4.5;
    local_670 = 1.0;
    Eigen::operator-(&local_668,&local_670,(StorageBaseType *)local_2e0);
    Eigen::operator*(&local_600,&local_608,(StorageBaseType *)&local_668);
    local_6d8 = 0.3333333333333333;
    Eigen::operator-(&local_6d0,&local_6d8,(StorageBaseType *)local_2e0);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>>
    ::operator*(&local_578,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
                 *)&local_600,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                 *)&local_6d0);
    local_740 = 0.6666666666666666;
    Eigen::operator-(&local_738,&local_740,(StorageBaseType *)local_2e0);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>>
    ::operator*(&local_480,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
                 *)&local_578,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                 *)&local_738);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_778,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_778,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
                *)&local_480);
    local_9d8 = 4.5;
    Eigen::operator*(&local_9d0,&local_9d8,(StorageBaseType *)local_2e0);
    local_a38 = 0.3333333333333333;
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>>
    ::operator-(&local_a30,
                (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                 *)local_2e0,&local_a38);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>>
    ::operator*(&local_970,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>>
                 *)&local_9d0,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                 *)&local_a30);
    local_a98 = 0.6666666666666666;
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>>
    ::operator-(&local_a90,
                (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                 *)local_2e0,&local_a98);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const>const>>
    ::operator*(&local_8a8,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>>
                 *)&local_970,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                 *)&local_a90);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_ad0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,1);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_ad0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>_>
                *)&local_8a8);
    local_d48 = 13.5;
    Eigen::operator*(&local_d40,&local_d48,(StorageBaseType *)local_2e0);
    local_dac = 1;
    Eigen::operator-(&local_da8,&local_dac,(StorageBaseType *)local_2e0);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>>
    ::operator*(&local_ce0,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>>
                 *)&local_d40,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                 *)&local_da8);
    local_e18 = 0.6666666666666666;
    Eigen::operator-(&local_e10,&local_e18,(StorageBaseType *)local_2e0);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>>
    ::operator*(&local_c10,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
                 *)&local_ce0,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                 *)&local_e10);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_e50,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,2);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_e50,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
                *)&local_c10);
    local_10c0 = 13.5;
    Eigen::operator*(&local_10b8,&local_10c0,(StorageBaseType *)local_2e0);
    local_1124 = 1;
    Eigen::operator-(&local_1120,&local_1124,(StorageBaseType *)local_2e0);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>>
    ::operator*(&local_1058,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>>
                 *)&local_10b8,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                 *)&local_1120);
    local_1188 = 0.3333333333333333;
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>>
    ::operator-(&local_1180,
                (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>>
                 *)local_2e0,&local_1188);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>>
    ::operator*(&local_f88,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
                 *)&local_1058,
                (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                 *)&local_1180);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_11c0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,3);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_11c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>_>
                *)&local_f88);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"Reference coordinates must be 1-vectors");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"refcoords.rows() == 1",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0x4b1,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&n_pts,"",&local_299);
  lf::base::AssertionFailed(&local_248,&local_270,0x4b1,(string *)&n_pts);
  std::__cxx11::string::~string((string *)&n_pts);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 1,
                  "Reference coordinates must be 1-vectors");
    const size_type n_pts(refcoords.cols());

    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(4, n_pts);

    auto x = refcoords.row(0).array();

    // endpoints
    result.row(0) = 4.5 * (1.0 - x) * (1.0 / 3.0 - x) * (2.0 / 3.0 - x);
    result.row(1) = 4.5 * x * (x - 1.0 / 3.0) * (x - 2.0 / 3.0);

    // interior
    result.row(2) = 13.5 * x * (1 - x) * (2.0 / 3.0 - x);
    result.row(3) = 13.5 * x * (1 - x) * (x - 1.0 / 3.0);

    return result;
  }